

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  Float radius;
  uint uVar1;
  undefined8 uVar2;
  size_t sVar3;
  LensElementInterface *pLVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar15 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar30;
  undefined1 auVar31 [16];
  Float t;
  Point3fi o;
  Transform LensFromCamera;
  float local_15c;
  Point3fi local_158;
  Ray local_140;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Transform local_b0;
  undefined1 extraout_var_01 [56];
  
  sVar3 = (this->elementInterfaces).nStored;
  fVar30 = 0.0;
  fVar14 = 0.0;
  if (sVar3 != 0) {
    lVar9 = 0;
    do {
      fVar30 = fVar30 + *(float *)((long)&((this->elementInterfaces).ptr)->thickness + lVar9);
      lVar9 = lVar9 + 0x10;
      fVar14 = fVar30;
    } while (sVar3 << 4 != lVar9);
  }
  local_108 = ZEXT416((uint)fVar14);
  Scale(&local_b0,1.0,1.0,-1.0);
  fVar30 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = fVar30;
  auVar12._0_4_ = fVar30;
  auVar12._8_4_ = fVar30;
  auVar12._12_4_ = fVar30;
  fVar30 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar11._4_4_ = fVar30;
  auVar11._0_4_ = fVar30;
  auVar11._8_4_ = fVar30;
  auVar11._12_4_ = fVar30;
  auVar12 = vmovlhps_avx(auVar12,auVar11);
  fVar30 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._4_4_ = fVar30;
  auVar17._0_4_ = fVar30;
  auVar17._8_4_ = fVar30;
  auVar17._12_4_ = fVar30;
  local_140.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar12._0_8_;
  local_140.o.super_Tuple3<pbrt::Point3,_float>.z = auVar12._8_4_;
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar12._12_4_;
  uVar2 = vmovlps_avx(auVar17);
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::operator()(&local_158,&local_b0,(Point3fi *)&local_140);
  fVar30 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar14 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar13 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * local_b0.m.m[0][1])),ZEXT416((uint)fVar30),
                            ZEXT416((uint)local_b0.m.m[0][0]));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar13),ZEXT416((uint)local_b0.m.m[0][2]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * local_b0.m.m[1][1])),ZEXT416((uint)fVar30),
                            ZEXT416((uint)local_b0.m.m[1][0]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar13),ZEXT416((uint)local_b0.m.m[1][2]));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * local_b0.m.m[2][1])),ZEXT416((uint)fVar30),
                            ZEXT416((uint)local_b0.m.m[2][0]));
  local_118 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar13),ZEXT416((uint)local_b0.m.m[2][2]));
  fVar30 = auVar11._0_4_;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar30 * fVar30)),auVar12,auVar12);
  auVar17 = vfmadd231ss_fma(auVar17,local_118,local_118);
  if (0.0 < auVar17._0_4_) {
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx(auVar12,auVar18);
    auVar6 = vandps_avx(auVar11,auVar18);
    auVar18 = vandps_avx(local_118,auVar18);
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar5);
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT816(0) << 0x40,auVar18);
    fVar13 = auVar5._0_4_ / auVar17._0_4_;
    fVar14 = auVar12._0_4_ * fVar13;
    local_f8 = ZEXT416((uint)(fVar30 * fVar13));
    local_e8 = ZEXT416((uint)(local_118._0_4_ * fVar13));
    i.high = fVar14;
    i.low = fVar14;
    local_d8 = auVar11;
    local_c8 = auVar12;
    auVar28._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_158,i);
    auVar28._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar28._0_16_);
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)uVar2;
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = (float)((ulong)uVar2 >> 0x20);
    i_00.high = (float)local_f8._0_4_;
    i_00.low = (float)local_f8._0_4_;
    auVar29._0_8_ =
         Interval<float>::operator+<float>
                   (&local_158.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar29._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar29._0_16_);
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)uVar2;
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = (float)((ulong)uVar2 >> 0x20);
    i_01.high = (float)local_e8._0_4_;
    i_01.low = (float)local_e8._0_4_;
    auVar16._0_8_ =
         Interval<float>::operator+<float>
                   (&local_158.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar16._8_56_ = extraout_var_01;
    local_158.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
         (Interval<float>)vmovlps_avx(auVar16._0_16_);
    auVar12 = local_c8;
    auVar11 = local_d8;
  }
  auVar12 = vinsertps_avx(auVar12,auVar11,0x10);
  auVar6._4_4_ = local_158.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar6._0_4_ = local_158.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar6._8_4_ = local_158.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar6._12_4_ =
       local_158.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  local_140.o.super_Tuple3<pbrt::Point3,_float>.z =
       (local_158.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       local_158.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_140.time = rCamera->time;
  local_140.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(rCamera->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar11 = vinsertps_avx(auVar6,ZEXT416((uint)local_158.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar19._0_4_ =
       local_158.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar11._0_4_;
  auVar19._4_4_ =
       local_158.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar11._4_4_;
  auVar19._8_4_ = auVar11._8_4_ + 0.0;
  auVar19._12_4_ = auVar11._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  auVar11 = vmulps_avx512vl(auVar19,auVar5);
  local_140.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11);
  uVar2 = vmovlps_avx(auVar12);
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  local_140.d.super_Tuple3<pbrt::Vector3,_float>.z = local_118._0_4_;
  if ((this->elementInterfaces).nStored != 0) {
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(local_108,auVar7);
    auVar28 = ZEXT1664(auVar12);
    lVar9 = 0;
    auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar10 = 0;
    do {
      pLVar4 = (this->elementInterfaces).ptr;
      local_158.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
      local_158.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
      local_158.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
      radius = *(Float *)((long)&pLVar4->curvatureRadius + lVar9);
      local_108._0_4_ = radius;
      if ((radius != 0.0) || (NAN(radius))) {
        local_118 = auVar28._0_16_;
        bVar8 = IntersectSphericalElement
                          (radius,auVar28._0_4_ + radius,&local_140,&local_15c,
                           (Normal3f *)&local_158);
        auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar28 = ZEXT1664(local_118);
        if (bVar8) goto LAB_003588dc;
LAB_00358915:
        bVar8 = false;
      }
      else {
        local_15c = (auVar28._0_4_ - local_140.o.super_Tuple3<pbrt::Point3,_float>.z) /
                    local_140.d.super_Tuple3<pbrt::Vector3,_float>.z;
        if (local_15c < 0.0) goto LAB_00358915;
LAB_003588dc:
        auVar31._4_4_ = local_140.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar31._0_4_ = local_140.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar31._8_8_ = 0;
        auVar20._0_4_ =
             local_140.d.super_Tuple3<pbrt::Vector3,_float>.x * local_15c +
             local_140.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar20._4_4_ =
             local_140.d.super_Tuple3<pbrt::Vector3,_float>.y * local_15c +
             local_140.o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar20._8_4_ = local_15c * 0.0 + 0.0;
        auVar20._12_4_ = local_15c * 0.0 + 0.0;
        auVar22._0_4_ = auVar20._0_4_ * auVar20._0_4_;
        auVar22._4_4_ = auVar20._4_4_ * auVar20._4_4_;
        auVar22._8_4_ = auVar20._8_4_ * auVar20._8_4_;
        auVar22._12_4_ = auVar20._12_4_ * auVar20._12_4_;
        auVar12 = vmovshdup_avx(auVar22);
        auVar12 = vfmadd231ss_fma(auVar12,auVar20,auVar20);
        fVar30 = *(float *)((long)&pLVar4->apertureRadius + lVar9);
        if (fVar30 * fVar30 < auVar12._0_4_) goto LAB_00358915;
        local_140.o.super_Tuple3<pbrt::Point3,_float>.z =
             local_15c * local_140.d.super_Tuple3<pbrt::Vector3,_float>.z +
             local_140.o.super_Tuple3<pbrt::Point3,_float>.z;
        local_140.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar20);
        if (((float)local_108._0_4_ != 0.0) || (NAN((float)local_108._0_4_))) {
          fVar30 = 1.0;
          if (uVar10 != 0) {
            fVar14 = *(float *)((long)(this->elementInterfaces).ptr + lVar9 + -8);
            if ((fVar14 != 0.0) || (fVar30 = 1.0, NAN(fVar14))) {
              fVar30 = fVar14;
            }
          }
          uVar1 = *(uint *)((long)&((this->elementInterfaces).ptr)->eta + lVar9);
          auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_140.d.super_Tuple3<pbrt::Vector3,_float>.y
                                                  * local_140.d.super_Tuple3<pbrt::Vector3,_float>.y
                                                  )),auVar31,auVar31);
          auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)local_140.d.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.z))
          ;
          if (auVar12._0_4_ < 0.0) {
            local_118 = auVar28._0_16_;
            local_c8._0_4_ = fVar30;
            local_d8 = ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.y);
            local_e8 = ZEXT416(uVar1);
            local_f8 = ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.z);
            local_108 = auVar31;
            fVar14 = sqrtf(auVar12._0_4_);
            auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar28 = ZEXT1664(local_118);
            auVar12 = local_f8;
            auVar11 = local_d8;
            auVar17 = local_e8;
            auVar31 = local_108;
            fVar30 = (float)local_c8._0_4_;
          }
          else {
            auVar12 = vsqrtss_avx(auVar12,auVar12);
            fVar14 = auVar12._0_4_;
            auVar12 = ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.z);
            auVar11 = ZEXT416((uint)local_140.d.super_Tuple3<pbrt::Vector3,_float>.y);
            auVar17 = ZEXT416(uVar1);
          }
          uVar2 = vcmpss_avx512f(auVar17,auVar29._0_16_,4);
          bVar8 = (bool)((byte)uVar2 & 1);
          auVar23._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
          auVar23._8_4_ = auVar12._8_4_ ^ 0x80000000;
          auVar23._12_4_ = auVar12._12_4_ ^ 0x80000000;
          auVar11 = vinsertps_avx(auVar31,auVar11,0x10);
          auVar25._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
          auVar25._8_4_ = auVar11._8_4_ ^ 0x80000000;
          auVar25._12_4_ = auVar11._12_4_ ^ 0x80000000;
          auVar26._4_4_ = fVar14;
          auVar26._0_4_ = fVar14;
          auVar26._8_4_ = fVar14;
          auVar26._12_4_ = fVar14;
          auVar11 = vdivps_avx(auVar25,auVar26);
          auVar5 = vmovshdup_avx(auVar11);
          auVar27._0_4_ = -auVar12._0_4_ / fVar14;
          auVar27._4_12_ = auVar23._4_12_;
          fVar30 = (float)((uint)bVar8 * auVar17._0_4_ + (uint)!bVar8 * 0x3f800000) / fVar30;
          auVar12 = vfmadd132ss_fma(auVar5,ZEXT416((uint)(auVar27._0_4_ *
                                                         local_158.
                                                         super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low)),
                                    ZEXT416((uint)local_158.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high));
          auVar17 = vfmsub213ss_fma(ZEXT416((uint)local_158.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low),auVar27,
                                    ZEXT416((uint)(auVar27._0_4_ *
                                                  local_158.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low)));
          auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ + auVar17._0_4_)),auVar11,
                                    ZEXT416((uint)local_158.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low));
          auVar12 = vfnmadd213ss_fma(auVar17,auVar17,SUB6416(ZEXT464(0x3f800000),0));
          fVar14 = 0.0;
          auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x20);
          fVar13 = auVar12._0_4_ / (fVar30 * fVar30);
          auVar12 = ZEXT816(0) << 0x20;
          if (fVar13 < 1.0) {
            auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar13)),auVar29._0_16_);
            if (auVar12._0_4_ < 0.0) {
              local_118 = auVar28._0_16_;
              local_108._0_4_ = auVar27._0_4_;
              local_e8._0_4_ = fVar13;
              local_f8._0_4_ = auVar17._0_4_;
              local_d8 = auVar11;
              local_c8 = ZEXT416((uint)fVar30);
              fVar14 = sqrtf(auVar12._0_4_);
              fVar30 = local_c8._0_4_;
              auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar28 = ZEXT1664(local_118);
              auVar11 = local_d8;
              fVar13 = (float)local_e8._0_4_;
              fVar24 = (float)local_f8._0_4_;
              auVar27._0_4_ = (float)local_108._0_4_;
            }
            else {
              auVar12 = vsqrtss_avx(auVar12,auVar12);
              fVar14 = auVar12._0_4_;
              fVar24 = auVar17._0_4_;
            }
            fVar14 = fVar24 / fVar30 - fVar14;
            auVar21._4_4_ = fVar30;
            auVar21._0_4_ = fVar30;
            auVar21._8_4_ = fVar30;
            auVar21._12_4_ = fVar30;
            auVar12 = vdivps_avx(auVar11,auVar21);
            auVar15._0_4_ =
                 fVar14 * local_158.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
            auVar15._4_4_ =
                 fVar14 * local_158.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            auVar15._8_4_ = fVar14 * 0.0;
            auVar15._12_4_ = fVar14 * 0.0;
            auVar12 = vsubps_avx(auVar15,auVar12);
            fVar14 = fVar14 * local_158.super_Point3<pbrt::Interval<float>_>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low -
                     auVar27._0_4_ / fVar30;
          }
          if (1.0 <= fVar13) goto LAB_00358915;
          uVar2 = vmovlps_avx(auVar12);
          local_140.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
          local_140.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
          local_140.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar14;
        }
        auVar28 = ZEXT464((uint)(auVar28._0_4_ + *(float *)((long)&pLVar4->thickness + lVar9)));
        bVar8 = true;
      }
      if (!bVar8) {
        return 0.0;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 < (this->elementInterfaces).nStored);
  }
  if (rOut != (Ray *)0x0) {
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.x = local_140.o.super_Tuple3<pbrt::Point3,_float>.x;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.y = local_140.o.super_Tuple3<pbrt::Point3,_float>.y;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.z = -local_140.o.super_Tuple3<pbrt::Point3,_float>.z
    ;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x =
         local_140.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.y =
         local_140.d.super_Tuple3<pbrt::Vector3,_float>.y;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.z =
         -local_140.d.super_Tuple3<pbrt::Vector3,_float>.z;
    rOut->time = local_140.time;
    (rOut->medium).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
  }
  return 1.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}